

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void namedVariable(Token name,_Bool canAssign)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  uint8_t uVar4;
  uint8_t byte1;
  
  uVar3 = resolveLocal(current,&name);
  if (uVar3 == 0xffffffff) {
    uVar3 = resolveUpvalue(current,&name);
    if (uVar3 == 0xffffffff) {
      bVar1 = identifierConstant(&name);
      uVar3 = (uint)bVar1;
      uVar4 = '\t';
      byte1 = '\x06';
    }
    else {
      uVar4 = '\v';
      byte1 = '\n';
    }
  }
  else {
    uVar4 = '\b';
    byte1 = '\x05';
  }
  if (canAssign) {
    _Var2 = match(TOKEN_EQUAL);
    if (_Var2) {
      expression();
      byte1 = uVar4;
    }
  }
  emitBytes(byte1,(uint8_t)uVar3);
  return;
}

Assistant:

static void namedVariable(Token name, bool canAssign) {
    uint8_t getOp, setOp;
    /**
     * Check if this variable is local first if it is use is
     * else it must be global
     */
    int arg = resolveLocal(current, &name);
    //Check if variable is local
    if (arg != -1) {
        getOp = OP_GET_LOCAL;
        setOp = OP_SET_LOCAL;
    }
    //Check if variable is in local scopes of enclosing functions
    else if ((arg = resolveUpvalue(current, &name)) != -1) {
        getOp = OP_GET_UPVALUE;
        setOp = OP_SET_UPVALUE;
    }
    //Variable now must be global
    else {
        arg = identifierConstant(&name);
        getOp = OP_GET_GLOBAL;
        setOp = OP_SET_GLOBAL;
    }

    if (canAssign && match(TOKEN_EQUAL)) {
        expression();
        emitBytes(setOp, (uint8_t) arg);
    } else {
        emitBytes(getOp, (uint8_t) arg);
    }
}